

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O1

void __thiscall
icu_63::UCharCharacterIterator::UCharCharacterIterator
          (UCharCharacterIterator *this,ConstChar16Ptr *textPtr,int32_t length,int32_t position)

{
  if (textPtr->p_ == (UChar *)0x0) {
    length = 0;
  }
  else if (length < 0) {
    length = u_strlen_63(textPtr->p_);
  }
  CharacterIterator::CharacterIterator(&this->super_CharacterIterator,length,position);
  (this->super_CharacterIterator).super_ForwardCharacterIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UCharCharacterIterator_003f8420;
  this->text = textPtr->p_;
  return;
}

Assistant:

UCharCharacterIterator::UCharCharacterIterator(ConstChar16Ptr textPtr,
                                               int32_t length,
                                               int32_t position)
  : CharacterIterator(textPtr != 0 ? (length>=0 ? length : u_strlen(textPtr)) : 0, position),
  text(textPtr)
{
}